

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  bool bVar1;
  Tables *pTVar2;
  FieldDescriptor *result;
  MutexLockMaybe lock;
  int number_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  lock.mu_._4_4_ = number;
  internal::MutexLockMaybe::MutexLockMaybe((MutexLockMaybe *)&result,this->mutex_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  this_local = (DescriptorPool *)Tables::FindExtension(pTVar2,extendee,lock.mu_._4_4_);
  if ((this_local == (DescriptorPool *)0x0) &&
     ((this->underlay_ == (DescriptorPool *)0x0 ||
      (this_local = (DescriptorPool *)FindExtensionByNumber(this->underlay_,extendee,lock.mu_._4_4_)
      , this_local == (DescriptorPool *)0x0)))) {
    bVar1 = TryFindExtensionInFallbackDatabase(this,extendee,lock.mu_._4_4_);
    if (bVar1) {
      pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      this_local = (DescriptorPool *)Tables::FindExtension(pTVar2,extendee,lock.mu_._4_4_);
      if (this_local != (DescriptorPool *)0x0) goto LAB_002b974f;
    }
    this_local = (DescriptorPool *)0x0;
  }
LAB_002b974f:
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)&result);
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  MutexLockMaybe lock(mutex_);
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != NULL) {
    return result;
  }
  if (underlay_ != NULL) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != NULL) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != NULL) {
      return result;
    }
  }
  return NULL;
}